

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

void ensure_ev_owned(CManager_conflict cm,event_item *event)

{
  if ((event->contents == Event_App_Owned) && (event->free_func == (EVFreeFunction)0x0)) {
    encode_event((CManager_conflict)event,event);
    event->decoded_event = (void *)0x0;
    event->event_encoded = 1;
    event->contents = Event_CM_Owned;
    if (event->encoded_event == (void *)0x0) {
      __assert_fail("event->encoded_event",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                    ,0x3bb,"void ensure_ev_owned(CManager, event_item *)");
    }
  }
  return;
}

Assistant:

extern void 
ensure_ev_owned(CManager cm, event_item *event)
{
    if (event->contents == Event_App_Owned && !event->free_func) {
        encode_event(cm, event);
        event->decoded_event = NULL;
        event->event_encoded = 1;
        event->contents = Event_CM_Owned;
        assert(event->encoded_event);
    }
}